

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O3

void add_source_fdtd_2D(source_type sType,fdtd2D *fdtd,fdtd_source src,float_type positionX,
                       float_type positionY)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  undefined8 in_RCX;
  code *extraout_RDX;
  double dVar6;
  double dVar7;
  uint uVar8;
  undefined4 in_register_0000003c;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  long lVar16;
  double dVar17;
  long lVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 in_register_00001208 [56];
  undefined1 auVar22 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar23 [64];
  double dStack_c0;
  ulong uStack_30;
  
  auVar23._8_56_ = in_register_00001248;
  auVar23._0_8_ = positionY;
  auVar22._8_56_ = in_register_00001208;
  auVar22._0_8_ = positionX;
  pdVar9 = (double *)CONCAT44(in_register_0000003c,sType);
  auVar3 = vunpcklpd_avx(auVar22._0_16_,auVar23._0_16_);
  auVar19._0_8_ = fdtd->dx;
  auVar19._8_8_ = fdtd->dy;
  auVar19 = vdivpd_avx(auVar3,auVar19);
  auVar19 = vroundpd_avx(auVar19,9);
  auVar19 = vcvttpd2uqq_avx512vl(auVar19);
  if (auVar19._0_8_ < fdtd->sizeX) {
    uVar4 = vpextrq_avx(auVar19,1);
    if (uVar4 < fdtd->sizeY) {
      if (sType == source_electric) {
        lVar16 = 0xe8;
        lVar13 = 0xf0;
        lVar18 = 0xe0;
      }
      else {
        if (sType != source_magnetic) {
          return;
        }
        lVar16 = 0x100;
        lVar13 = 0x108;
        lVar18 = 0xf8;
      }
      uVar8 = *(int *)((long)fdtd->psi_hx_y + lVar18 + -0x40) + 1;
      *(uint *)((long)fdtd->psi_hx_y + lVar18 + -0x40) = uVar8;
      pvVar5 = realloc(*(void **)((long)fdtd->psi_hx_y + lVar13 + -0x40),(ulong)uVar8 << 4);
      *(void **)((long)fdtd->psi_hx_y + lVar13 + -0x40) = pvVar5;
      uStack_30 = auVar19._8_8_;
      uVar8 = *(uint *)((long)fdtd->psi_hx_y + lVar18 + -0x40);
      puVar1 = (ulong *)((long)pvVar5 + (ulong)(uVar8 - 1) * 0x10);
      *puVar1 = auVar19._0_8_;
      puVar1[1] = uStack_30;
      pvVar5 = realloc(*(void **)((long)fdtd->psi_hx_y + lVar16 + -0x40),(ulong)uVar8 << 5);
      *(void **)((long)fdtd->psi_hx_y + lVar16 + -0x40) = pvVar5;
      puVar2 = (undefined8 *)
               ((long)pvVar5 + (ulong)(*(int *)((long)fdtd->psi_hx_y + lVar18 + -0x40) - 1) * 0x20);
      *puVar2 = src._0_8_;
      puVar2[1] = src.field_1.field_0.gaussian_pulse_delay;
      puVar2[2] = src.field_1.field_0.gaussian_pulse_peak_time;
      puVar2[3] = src.field_1.field_0.gaussian_peak_val;
      return;
    }
  }
  else {
    add_source_fdtd_2D_cold_1();
  }
  add_source_fdtd_2D_cold_2();
  dVar10 = pdVar9[0x31];
  if (dVar10 != 0.0) {
    dVar21 = pdVar9[0x33];
    dVar12 = pdVar9[0x32];
    dStack_c0 = pdVar9[0xb];
    dVar15 = pdVar9[10];
    dVar20 = 0.0;
    dVar7 = 0.0;
    lVar13 = (long)dVar21 * 8;
    lVar16 = (long)dVar21 * (long)dVar12 * 8;
    dVar14 = dVar12;
    do {
      if (dVar12 == 0.0) {
        dVar12 = 0.0;
      }
      else {
        dVar10 = 0.0;
        dVar11 = 0.0;
        dVar6 = dStack_c0;
        dVar12 = dVar14;
        dVar14 = dVar15;
        do {
          if (dVar21 == 0.0) {
            dVar21 = 0.0;
          }
          else {
            dVar12 = 0.0;
            dVar17 = 0.0;
            do {
              dVar21 = (double)(*(code *)fdtd)(dVar20,dVar10,in_RCX);
              *(double *)((long)dVar6 + (long)dVar17 * 8) = 1.0 / (dVar21 * 1.2566370614359173e-06);
              dVar21 = (double)(*extraout_RDX)(dVar20,dVar10,dVar12,in_RCX);
              *(double *)((long)dVar14 + (long)dVar17 * 8) = 1.0 / (dVar21 * 8.85418781762039e-12);
              dVar17 = (double)((long)dVar17 + 1);
              dVar12 = dVar12 + pdVar9[2];
              dVar21 = pdVar9[0x33];
            } while ((ulong)dVar17 < (ulong)dVar21);
            dVar12 = pdVar9[0x32];
          }
          dVar10 = dVar10 + pdVar9[1];
          dVar11 = (double)((long)dVar11 + 1);
          dVar14 = (double)((long)dVar14 + lVar13);
          dVar6 = (double)((long)dVar6 + lVar13);
        } while ((ulong)dVar11 < (ulong)dVar12);
        dVar10 = pdVar9[0x31];
        dVar14 = dVar12;
      }
      dVar20 = dVar20 + *pdVar9;
      dVar7 = (double)((long)dVar7 + 1);
      dStack_c0 = (double)((long)dStack_c0 + lVar16);
      dVar15 = (double)((long)dVar15 + lVar16);
    } while ((ulong)dVar7 < (ulong)dVar10);
  }
  return;
}

Assistant:

void add_source_fdtd_2D(enum source_type sType, struct fdtd2D *fdtd,
                        struct fdtd_source src, float_type positionX,
                        float_type positionY) {
  float_type posXf = floor(positionX / fdtd->dx);
  float_type posYf = floor(positionY / fdtd->dy);
  uintmax_t posX = (uintmax_t)posXf;
  uintmax_t posY = (uintmax_t)posYf;
  if (posX >= fdtd->sizeX) {
    fprintf(stderr, "add_source_fdtd_2D: adding source outside of the X "
                    "dimension boundaries\n");
    exit(EXIT_FAILURE);
  }
  if (posY >= fdtd->sizeY) {
    fprintf(stderr, "add_source_fdtd_2D: adding source outside of the Y "
                    "dimension boundaries\n");
    exit(EXIT_FAILURE);
  }
  switch (sType) {
  case source_electric: {
    fdtd->num_Jsources++;
    fdtd->JsourceLocations = realloc(
        fdtd->JsourceLocations, VLA_2D_size(uintmax_t, fdtd->num_Jsources, 2));
    VLA_2D_definition(uintmax_t, fdtd->num_Jsources, 2, JsourceLocations,
                      fdtd->JsourceLocations);
    JsourceLocations[fdtd->num_Jsources - 1][0] = posX;
    JsourceLocations[fdtd->num_Jsources - 1][1] = posY;
    fdtd->Jsources =
        realloc(fdtd->Jsources, fdtd->num_Jsources * sizeof(*fdtd->Jsources));
    fdtd->Jsources[fdtd->num_Jsources - 1] = src;
    break;
  }
  case source_magnetic:
    fdtd->num_Msources++;
    fdtd->MsourceLocations = realloc(
        fdtd->MsourceLocations, VLA_2D_size(uintmax_t, fdtd->num_Msources, 2));
    VLA_2D_definition(uintmax_t, fdtd->num_Msources, 2, MsourceLocations,
                      fdtd->MsourceLocations);
    MsourceLocations[fdtd->num_Msources - 1][0] = posX;
    MsourceLocations[fdtd->num_Msources - 1][1] = posY;
    fdtd->Msources =
        realloc(fdtd->Msources, fdtd->num_Msources * sizeof(*fdtd->Msources));
    fdtd->Msources[fdtd->num_Msources - 1] = src;
    break;
  }
}